

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O1

int16_t modify_weight_for_curse(wchar_t i,int16_t weight)

{
  ushort uVar1;
  object *poVar2;
  _Bool _Var3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  
  if ((L'\xffffffff' < i) && (i < (int)(uint)z_info->curse_max)) {
    poVar2 = curses[(uint)i].obj;
    _Var3 = flag_has_dbg(poVar2->flags,5,0x26,"curse_obj->flags","OF_MULTIPLY_WEIGHT");
    if (_Var3) {
      sVar4 = poVar2->weight;
      if (sVar4 < 0) {
        __assert_fail("curse_obj->weight >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-curse.c"
                      ,399,"int16_t modify_weight_for_curse(int, int16_t)");
      }
      if (sVar4 < 0x65) {
        uVar5 = 0;
        if (0 < weight) {
          uVar5 = weight;
        }
      }
      else {
        uVar5 = 1;
        if (1 < weight) {
          uVar5 = weight;
        }
      }
      uVar6 = (uint)uVar5 * (int)sVar4;
      sVar4 = 0x7fff;
      if (uVar6 < 0x31ff9c) {
        sVar4 = ((short)(uVar6 / 100) + 1) - (ushort)(uVar6 % 100 < 0x32);
      }
    }
    else {
      uVar5 = 0;
      if (0 < weight) {
        uVar5 = weight;
      }
      uVar1 = poVar2->weight;
      if ((short)uVar1 < 0) {
        sVar4 = 0;
        if (0 < (short)(uVar1 + uVar5)) {
          sVar4 = uVar1 + uVar5;
        }
      }
      else {
        sVar4 = uVar5 + uVar1;
        if ((uVar1 ^ 0x7fff) <= uVar5) {
          sVar4 = 0x7fff;
        }
      }
    }
    return sVar4;
  }
  __assert_fail("i >= 0 && i < z_info->curse_max",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-curse.c"
                ,0x182,"int16_t modify_weight_for_curse(int, int16_t)");
}

Assistant:

int16_t modify_weight_for_curse(int i, int16_t weight)
{
	const struct object *curse_obj;
	int16_t result;

	assert(i >= 0 && i < z_info->curse_max);
	curse_obj = curses[i].obj;

	if (of_has(curse_obj->flags, OF_MULTIPLY_WEIGHT)) {
		/*
		 * Apply a multiplicative factor of curse_obj->weight over 100
		 * and round to the nearest integer.  Coerce the incoming weight
		 * to be at least one if the multiplicative factor is greater
		 * than one.  That allows multiplicative factors to be of some
		 * use with otherwise weightless items.
		 */
		int32_t scaled, q;

		assert(curse_obj->weight >= 0);
		if (curse_obj->weight > 100) {
			scaled = MAX(weight, 1);
		} else {
			scaled = MAX(weight, 0);
		}
		scaled *= curse_obj->weight;
		q = scaled / 100;
		if (q < 32767) {
			result = q;
			if (scaled % 100 >= 50) {
				++result;
			}
		} else {
			result = 32767;
		}
	} else {
		weight = MAX(0, weight);
		if (curse_obj->weight < 0) {
			result = weight + curse_obj->weight;
			if (result < 0) {
				result = 0;
			}
		} else {
			result = (weight < 32767 - curse_obj->weight) ?
				weight + curse_obj->weight : 32767;
		}
	}

	return result;
}